

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::UniqueFileScopeIdentifier_abi_cxx11_
          (string *__return_storage_ptr__,java *this,Descriptor *descriptor)

{
  string *s;
  allocator local_91;
  string local_90;
  allocator local_59;
  string local_58;
  string local_38;
  java *local_18;
  Descriptor *descriptor_local;
  
  local_18 = this;
  descriptor_local = (Descriptor *)__return_storage_ptr__;
  s = Descriptor::full_name_abi_cxx11_((Descriptor *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,".",&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"_",&local_91);
  StringReplace(&local_38,s,&local_58,&local_90,true);
  std::operator+(__return_storage_ptr__,"static_",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return __return_storage_ptr__;
}

Assistant:

string UniqueFileScopeIdentifier(const Descriptor* descriptor) {
  return "static_" + StringReplace(descriptor->full_name(), ".", "_", true);
}